

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  undefined1 auVar2 [16];
  JSValue this_obj;
  int iVar3;
  int iVar4;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  JSValueUnion extraout_RDX;
  JSValueUnion JVar7;
  JSValueUnion JVar8;
  JSValueUnion JVar9;
  undefined4 uVar10;
  int64_t iVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue prop;
  int64_t src_len;
  int64_t offset;
  JSValueUnion local_70;
  JSValueUnion local_58;
  JSValueUnion local_50;
  JSValueUnion local_48;
  int64_t local_40;
  long local_38;
  
  local_40 = this_val.tag;
  local_48 = this_val.u;
  if (argc < 2) {
    iVar11 = 3;
    JVar5.float64 = 0.0;
  }
  else {
    JVar5 = (JSValueUnion)argv[1].u.ptr;
    iVar11 = argv[1].tag;
  }
  JVar12 = *argv;
  if (((int)this_val.tag != -1) ||
     (JVar7 = local_48, 8 < (ushort)(*(short *)((long)local_48.ptr + 6) - 0x15U))) {
    JVar7.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not a %s","TypedArray");
  }
  JVar13 = (JSValue)(ZEXT816(3) << 0x40);
  if (JVar7.ptr != (void *)0x0) {
    if (0xfffffff4 < (uint)iVar11) {
      *(int *)JVar5.ptr = *JVar5.ptr + 1;
    }
    JVar13.tag = iVar11;
    JVar13.u.ptr = JVar5.ptr;
    iVar3 = JS_ToInt64SatFree(ctx,&local_38,JVar13);
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    if (iVar3 == 0) {
      if (local_38 < 0) {
        JVar13 = (JSValue)(ZEXT816(3) << 0x40);
        goto switchD_0016ebf2_caseD_3;
      }
      JVar13 = (JSValue)(ZEXT816(3) << 0x40);
      if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar7.ptr + 0x30) + 0x18) + 0x30) + 4) ==
          '\0') {
        JVar13 = JS_ToObject(ctx,JVar12);
        JVar12.tag = JVar13.tag;
        JVar5 = JVar13.u;
        if ((int)JVar13.tag != 6) {
          if ((ushort)(*(ushort *)((long)JVar5.ptr + 6) - 0x15) < 9) {
            lVar1 = *(long *)(*(long *)(*(long *)((long)JVar5.ptr + 0x30) + 0x18) + 0x30);
            uVar10 = 4;
            JVar6 = JVar5;
            if (*(char *)(lVar1 + 4) == '\0') {
              JVar6._4_4_ = 0;
              JVar6.int32 = *(uint *)((long)JVar5.ptr + 0x40);
              uVar10 = 3;
              local_58 = JVar6;
              if ((local_38 <= (long)((ulong)*(uint *)((long)JVar7.ptr + 0x40) - (long)JVar6)) &&
                 (uVar10 = 0, *(ushort *)((long)JVar5.ptr + 6) == *(ushort *)((long)JVar7.ptr + 6)))
              {
                memmove((void *)((local_38 <<
                                 ("includes"[(ulong)*(ushort *)((long)JVar7.ptr + 6) + 1] & 0x3fU))
                                + (ulong)*(uint *)(*(long *)((long)JVar7.ptr + 0x30) + 0x20) +
                                  *(long *)(*(long *)(*(long *)(*(long *)((long)JVar7.ptr + 0x30) +
                                                               0x18) + 0x30) + 8)),
                        (void *)((ulong)*(uint *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20) +
                                *(long *)(lVar1 + 8)),
                        (long)JVar6.ptr <<
                        ("includes"[(ulong)*(ushort *)((long)JVar7.ptr + 6) + 1] & 0x3fU));
                uVar10 = 5;
                JVar6 = extraout_RDX;
              }
            }
            switch(uVar10) {
            case 0:
switchD_0016ebf2_caseD_0:
              JVar7 = local_58;
              if (0 < (long)local_58.ptr) {
                JVar8.float64 = 0.0;
                local_50 = JVar5;
                do {
                  iVar3 = JVar8.int32;
                  JVar5.float64 = (double)JVar8.float64;
                  if (-1 < iVar3) {
                    JVar5 = JVar8;
                  }
                  iVar11 = 7;
                  if (-1 < iVar3) {
                    iVar11 = 0;
                  }
                  JVar12.u.ptr = local_50.ptr;
                  JVar14.tag = iVar11;
                  JVar14.u.float64 = JVar5.float64;
                  JVar14 = JS_GetPropertyValue(ctx,JVar12,JVar14);
                  if ((int)JVar14.tag == 6) goto LAB_0016ea7a;
                  JVar9._0_4_ = (int)local_38 + iVar3;
                  JVar9._4_4_ = 0;
                  JVar5.float64 = (double)JVar9.float64;
                  if (-1 < (int)JVar9._0_4_) {
                    JVar5 = JVar9;
                  }
                  iVar11 = 7;
                  if (-1 < (int)JVar9._0_4_) {
                    iVar11 = 0;
                  }
                  this_obj.tag = local_40;
                  this_obj.u.float64 = local_48.float64;
                  prop.tag = iVar11;
                  prop.u.float64 = JVar5.float64;
                  iVar4 = JS_SetPropertyValue(ctx,this_obj,prop,JVar14,0x4000);
                  if (iVar4 < 0) goto LAB_0016ea7a;
                  JVar8._0_4_ = iVar3 + 1;
                  JVar8._4_4_ = 0;
                } while ((long)JVar8.ptr < (long)JVar7.ptr);
              }
            case 5:
              JS_FreeValue(ctx,JVar13);
              JVar6.float64 = 1.48219693752374e-323;
              break;
            default:
              break;
            case 3:
switchD_0016ebf2_caseD_3:
              JS_ThrowRangeError(ctx,"invalid array length");
              goto LAB_0016ea7a;
            case 4:
              goto switchD_0016ebf2_caseD_4;
            }
            goto switchD_0016ebf2_caseD_1;
          }
          iVar3 = js_get_length64(ctx,(int64_t *)&local_58.int32,JVar13);
          if (iVar3 == 0) {
            if ((long)((ulong)*(uint *)((long)JVar7.ptr + 0x40) - (long)local_58) < local_38)
            goto switchD_0016ebf2_caseD_3;
            goto switchD_0016ebf2_caseD_0;
          }
        }
      }
      else {
switchD_0016ebf2_caseD_4:
        JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
      }
    }
  }
LAB_0016ea7a:
  local_70 = JVar13.u;
  if ((0xfffffff4 < (uint)JVar13.tag) &&
     (iVar3 = *local_70.ptr, *(int *)local_70.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar13);
  }
  JVar6.float64 = 2.96439387504748e-323;
switchD_0016ebf2_caseD_1:
  auVar2._8_8_ = 0;
  auVar2._0_8_ = JVar6;
  return (JSValue)(auVar2 << 0x40);
}

Assistant:

static JSValue js_typed_array_set(JSContext *ctx,
                                  JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValueConst offset = JS_UNDEFINED;
    if (argc > 1) {
        offset = argv[1];
    }
    return js_typed_array_set_internal(ctx, this_val, argv[0], offset);
}